

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

int glfwGetWindowAttrib(GLFWwindow *handle,int attrib)

{
  GLFWbool GVar1;
  int iVar2;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/window.c"
                  ,0x353,"int glfwGetWindowAttrib(GLFWwindow *, int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return 0;
  }
  switch(attrib) {
  case 0x20001:
    GVar1 = (*_glfw.platform.windowFocused)((_GLFWwindow *)handle);
    return GVar1;
  case 0x20002:
    GVar1 = (*_glfw.platform.windowIconified)((_GLFWwindow *)handle);
    return GVar1;
  case 0x20003:
    iVar2 = *(int *)(handle + 8);
    break;
  case 0x20004:
    GVar1 = (*_glfw.platform.windowVisible)((_GLFWwindow *)handle);
    return GVar1;
  case 0x20005:
    iVar2 = *(int *)(handle + 0xc);
    break;
  case 0x20006:
    iVar2 = *(int *)(handle + 0x10);
    break;
  case 0x20007:
    iVar2 = *(int *)(handle + 0x14);
    break;
  case 0x20008:
    GVar1 = (*_glfw.platform.windowMaximized)((_GLFWwindow *)handle);
    return GVar1;
  case 0x20009:
switchD_00145dc0_caseD_20009:
    iVar2 = 0;
    _glfwInputError(0x10003,"Invalid window attribute 0x%08X");
    break;
  case 0x2000a:
    GVar1 = (*_glfw.platform.framebufferTransparent)((_GLFWwindow *)handle);
    return GVar1;
  case 0x2000b:
    GVar1 = (*_glfw.platform.windowHovered)((_GLFWwindow *)handle);
    return GVar1;
  case 0x2000c:
    iVar2 = *(int *)(handle + 0x18);
    break;
  case 0x2000d:
    iVar2 = *(int *)(handle + 0x1c);
    break;
  default:
    switch(attrib) {
    case 0x22001:
      iVar2 = *(int *)(handle + 0x208);
      break;
    case 0x22002:
      iVar2 = *(int *)(handle + 0x210);
      break;
    case 0x22003:
      iVar2 = *(int *)(handle + 0x214);
      break;
    case 0x22004:
      iVar2 = *(int *)(handle + 0x218);
      break;
    case 0x22005:
      iVar2 = *(int *)(handle + 0x22c);
      break;
    case 0x22006:
      iVar2 = *(int *)(handle + 0x21c);
      break;
    case 0x22007:
      iVar2 = *(int *)(handle + 0x220);
      break;
    case 0x22008:
      iVar2 = *(int *)(handle + 0x228);
      break;
    case 0x22009:
      iVar2 = *(int *)(handle + 0x230);
      break;
    case 0x2200a:
      iVar2 = *(int *)(handle + 0x224);
      break;
    case 0x2200b:
      iVar2 = *(int *)(handle + 0x20c);
      break;
    default:
      if (attrib == 0x21010) {
        return *(int *)(handle + 0x30);
      }
      goto switchD_00145dc0_caseD_20009;
    }
  }
  return iVar2;
}

Assistant:

GLFWAPI int glfwGetWindowAttrib(GLFWwindow* handle, int attrib)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (attrib)
    {
        case GLFW_FOCUSED:
            return _glfw.platform.windowFocused(window);
        case GLFW_ICONIFIED:
            return _glfw.platform.windowIconified(window);
        case GLFW_VISIBLE:
            return _glfw.platform.windowVisible(window);
        case GLFW_MAXIMIZED:
            return _glfw.platform.windowMaximized(window);
        case GLFW_HOVERED:
            return _glfw.platform.windowHovered(window);
        case GLFW_FOCUS_ON_SHOW:
            return window->focusOnShow;
        case GLFW_MOUSE_PASSTHROUGH:
            return window->mousePassthrough;
        case GLFW_TRANSPARENT_FRAMEBUFFER:
            return _glfw.platform.framebufferTransparent(window);
        case GLFW_RESIZABLE:
            return window->resizable;
        case GLFW_DECORATED:
            return window->decorated;
        case GLFW_FLOATING:
            return window->floating;
        case GLFW_AUTO_ICONIFY:
            return window->autoIconify;
        case GLFW_DOUBLEBUFFER:
            return window->doublebuffer;
        case GLFW_CLIENT_API:
            return window->context.client;
        case GLFW_CONTEXT_CREATION_API:
            return window->context.source;
        case GLFW_CONTEXT_VERSION_MAJOR:
            return window->context.major;
        case GLFW_CONTEXT_VERSION_MINOR:
            return window->context.minor;
        case GLFW_CONTEXT_REVISION:
            return window->context.revision;
        case GLFW_CONTEXT_ROBUSTNESS:
            return window->context.robustness;
        case GLFW_OPENGL_FORWARD_COMPAT:
            return window->context.forward;
        case GLFW_CONTEXT_DEBUG:
            return window->context.debug;
        case GLFW_OPENGL_PROFILE:
            return window->context.profile;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            return window->context.release;
        case GLFW_CONTEXT_NO_ERROR:
            return window->context.noerror;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute 0x%08X", attrib);
    return 0;
}